

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.cpp
# Opt level: O0

int SetPosition(LinkedList *L,int pos)

{
  ostream *this;
  int local_20;
  int i;
  int pos_local;
  LinkedList *L_local;
  
  if (L->size == 0) {
    L_local._4_4_ = -1;
  }
  else if ((pos < 0) || (L->size + -1 < pos)) {
    this = std::operator<<((ostream *)&std::cout,"position error!");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    L_local._4_4_ = -1;
  }
  else {
    L->currPtr = L->front;
    L->prevPtr = (Node *)0x0;
    L->position = 0;
    for (local_20 = 0; local_20 < pos; local_20 = local_20 + 1) {
      L->position = L->position + 1;
      L->prevPtr = L->currPtr;
      L->currPtr = L->currPtr->next;
    }
    L_local._4_4_ = L->position;
  }
  return L_local._4_4_;
}

Assistant:

int SetPosition(LinkedList *L, int pos) { //重置链表当前结点位置的函数
    if(!L->size) return -1;  //链表为空
    if(pos<0 || pos>L->size-1) {
        cout << "position error!" << endl;
        return -1;
    }
    //寻找对应结点
    L->currPtr = L->front;
    L->prevPtr = NULL;
    L->position = 0;
    for(int i = 0; i < pos; i++) {
        L->position++;
        L->prevPtr = L->currPtr;
        L->currPtr = (L->currPtr)->next;
    }
    return L->position;  //返回当前结点位置
}